

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O0

void osd_msg(char *fmt,...)

{
  char *pcStack_118;
  retro_message screen_msg;
  va_list va;
  char acStack_e8 [8];
  char msg [201];
  char *fmt_local;
  
  msg[0xb8] = '\0';
  msg[0xb9] = '\0';
  msg[0xba] = '\0';
  msg[0xbb] = '\0';
  msg[0xbc] = '\0';
  msg[0xbd] = '\0';
  msg[0xbe] = '\0';
  msg[0xbf] = '\0';
  msg[0xc0] = '\0';
  msg[0xa8] = '\0';
  msg[0xa9] = '\0';
  msg[0xaa] = '\0';
  msg[0xab] = '\0';
  msg[0xac] = '\0';
  msg[0xad] = '\0';
  msg[0xae] = '\0';
  msg[0xaf] = '\0';
  msg[0xb0] = '\0';
  msg[0xb1] = '\0';
  msg[0xb2] = '\0';
  msg[0xb3] = '\0';
  msg[0xb4] = '\0';
  msg[0xb5] = '\0';
  msg[0xb6] = '\0';
  msg[0xb7] = '\0';
  msg[0x98] = '\0';
  msg[0x99] = '\0';
  msg[0x9a] = '\0';
  msg[0x9b] = '\0';
  msg[0x9c] = '\0';
  msg[0x9d] = '\0';
  msg[0x9e] = '\0';
  msg[0x9f] = '\0';
  msg[0xa0] = '\0';
  msg[0xa1] = '\0';
  msg[0xa2] = '\0';
  msg[0xa3] = '\0';
  msg[0xa4] = '\0';
  msg[0xa5] = '\0';
  msg[0xa6] = '\0';
  msg[0xa7] = '\0';
  msg[0x88] = '\0';
  msg[0x89] = '\0';
  msg[0x8a] = '\0';
  msg[0x8b] = '\0';
  msg[0x8c] = '\0';
  msg[0x8d] = '\0';
  msg[0x8e] = '\0';
  msg[0x8f] = '\0';
  msg[0x90] = '\0';
  msg[0x91] = '\0';
  msg[0x92] = '\0';
  msg[0x93] = '\0';
  msg[0x94] = '\0';
  msg[0x95] = '\0';
  msg[0x96] = '\0';
  msg[0x97] = '\0';
  msg[0x78] = '\0';
  msg[0x79] = '\0';
  msg[0x7a] = '\0';
  msg[0x7b] = '\0';
  msg[0x7c] = '\0';
  msg[0x7d] = '\0';
  msg[0x7e] = '\0';
  msg[0x7f] = '\0';
  msg[0x80] = '\0';
  msg[0x81] = '\0';
  msg[0x82] = '\0';
  msg[0x83] = '\0';
  msg[0x84] = '\0';
  msg[0x85] = '\0';
  msg[0x86] = '\0';
  msg[0x87] = '\0';
  msg[0x68] = '\0';
  msg[0x69] = '\0';
  msg[0x6a] = '\0';
  msg[0x6b] = '\0';
  msg[0x6c] = '\0';
  msg[0x6d] = '\0';
  msg[0x6e] = '\0';
  msg[0x6f] = '\0';
  msg[0x70] = '\0';
  msg[0x71] = '\0';
  msg[0x72] = '\0';
  msg[0x73] = '\0';
  msg[0x74] = '\0';
  msg[0x75] = '\0';
  msg[0x76] = '\0';
  msg[0x77] = '\0';
  msg[0x58] = '\0';
  msg[0x59] = '\0';
  msg[0x5a] = '\0';
  msg[0x5b] = '\0';
  msg[0x5c] = '\0';
  msg[0x5d] = '\0';
  msg[0x5e] = '\0';
  msg[0x5f] = '\0';
  msg[0x60] = '\0';
  msg[0x61] = '\0';
  msg[0x62] = '\0';
  msg[99] = '\0';
  msg[100] = '\0';
  msg[0x65] = '\0';
  msg[0x66] = '\0';
  msg[0x67] = '\0';
  msg[0x48] = '\0';
  msg[0x49] = '\0';
  msg[0x4a] = '\0';
  msg[0x4b] = '\0';
  msg[0x4c] = '\0';
  msg[0x4d] = '\0';
  msg[0x4e] = '\0';
  msg[0x4f] = '\0';
  msg[0x50] = '\0';
  msg[0x51] = '\0';
  msg[0x52] = '\0';
  msg[0x53] = '\0';
  msg[0x54] = '\0';
  msg[0x55] = '\0';
  msg[0x56] = '\0';
  msg[0x57] = '\0';
  msg[0x38] = '\0';
  msg[0x39] = '\0';
  msg[0x3a] = '\0';
  msg[0x3b] = '\0';
  msg[0x3c] = '\0';
  msg[0x3d] = '\0';
  msg[0x3e] = '\0';
  msg[0x3f] = '\0';
  msg[0x40] = '\0';
  msg[0x41] = '\0';
  msg[0x42] = '\0';
  msg[0x43] = '\0';
  msg[0x44] = '\0';
  msg[0x45] = '\0';
  msg[0x46] = '\0';
  msg[0x47] = '\0';
  msg[0x28] = '\0';
  msg[0x29] = '\0';
  msg[0x2a] = '\0';
  msg[0x2b] = '\0';
  msg[0x2c] = '\0';
  msg[0x2d] = '\0';
  msg[0x2e] = '\0';
  msg[0x2f] = '\0';
  msg[0x30] = '\0';
  msg[0x31] = '\0';
  msg[0x32] = '\0';
  msg[0x33] = '\0';
  msg[0x34] = '\0';
  msg[0x35] = '\0';
  msg[0x36] = '\0';
  msg[0x37] = '\0';
  msg[0x18] = '\0';
  msg[0x19] = '\0';
  msg[0x1a] = '\0';
  msg[0x1b] = '\0';
  msg[0x1c] = '\0';
  msg[0x1d] = '\0';
  msg[0x1e] = '\0';
  msg[0x1f] = '\0';
  msg[0x20] = '\0';
  msg[0x21] = '\0';
  msg[0x22] = '\0';
  msg[0x23] = '\0';
  msg[0x24] = '\0';
  msg[0x25] = '\0';
  msg[0x26] = '\0';
  msg[0x27] = '\0';
  msg[8] = '\0';
  msg[9] = '\0';
  msg[10] = '\0';
  msg[0xb] = '\0';
  msg[0xc] = '\0';
  msg[0xd] = '\0';
  msg[0xe] = '\0';
  msg[0xf] = '\0';
  msg[0x10] = '\0';
  msg[0x11] = '\0';
  msg[0x12] = '\0';
  msg[0x13] = '\0';
  msg[0x14] = '\0';
  msg[0x15] = '\0';
  msg[0x16] = '\0';
  msg[0x17] = '\0';
  acStack_e8[0] = '\0';
  acStack_e8[1] = '\0';
  acStack_e8[2] = '\0';
  acStack_e8[3] = '\0';
  acStack_e8[4] = '\0';
  acStack_e8[5] = '\0';
  acStack_e8[6] = '\0';
  acStack_e8[7] = '\0';
  msg[0] = '\0';
  msg[1] = '\0';
  msg[2] = '\0';
  msg[3] = '\0';
  msg[4] = '\0';
  msg[5] = '\0';
  msg[6] = '\0';
  msg[7] = '\0';
  screen_msg._12_4_ = 0x30;
  screen_msg.frames = 8;
  vsnprintf(acStack_e8,200,fmt,&screen_msg.frames);
  screen_msg.msg._4_4_ = 0;
  screen_msg.msg._0_4_ = 0x168;
  pcStack_118 = acStack_e8;
  (*env_cb)(6,&pcStack_118);
  return;
}

Assistant:

static void osd_msg(const char *fmt, ...)
{
   char msg[MAX_OSD_MSG_LEN + 1] = {0};

   va_list va;
   va_start(va, fmt);
   vsnprintf(msg, MAX_OSD_MSG_LEN, fmt, va);
   va_end(va);

   struct retro_message screen_msg = {0};
   screen_msg.msg = msg;
   screen_msg.frames = OSD_MSG_DURATION;

   env_cb(RETRO_ENVIRONMENT_SET_MESSAGE, &screen_msg);
}